

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPMI_RH_HIERARCHY_AUTH_Unmarshal(TPMI_RH_HIERARCHY_AUTH *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  TPM_RC TVar2;
  UINT32 UVar3;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  TVar2 = 0x9a;
  if (3 < iVar1) {
    UVar3 = ByteArrayToUint32(*buffer);
    *target = UVar3;
    *buffer = *buffer + 4;
    TVar2 = 0x84;
    if ((UVar3 + 0xbfffffff < 0xc) && ((0xe01U >> (UVar3 + 0xbfffffff & 0x1f) & 1) != 0)) {
      TVar2 = 0;
    }
  }
  return TVar2;
}

Assistant:

TPM_RC UINT32_Unmarshal(UINT32 *target, BYTE **buffer, INT32 *size)
{
    TPM_RC result;
    if ((*size -= 4) < 0)
    {
        result = TPM_RC_INSUFFICIENT;
    }
    else
    {
        *target = BYTE_ARRAY_TO_UINT32(*buffer);
        *buffer += 4;
        result = TPM_RC_SUCCESS;
    }
    return result;
}